

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::LdexpCaseInstance::compare
          (LdexpCaseInstance *this,void **inputs,void **outputs)

{
  uint uVar1;
  float a;
  pointer pSVar2;
  uint uVar3;
  deUint32 dVar4;
  int iVar5;
  ostream *poVar6;
  uint uVar7;
  Hex<8UL> hex;
  Hex<8UL> hex_00;
  ulong uVar8;
  ulong uVar9;
  deUint32 u32;
  double dVar10;
  Float<unsigned_int,_8,_23,_127,_3U> local_44;
  LdexpCaseInstance *local_40;
  HexFloat local_34;
  
  pSVar2 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = *(uint *)((long)&(pSVar2->varType).m_data + 4);
  local_40 = this;
  uVar3 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  uVar7 = ~(-1 << (0x17 - (&DAT_009f499c)[(ulong)uVar7 * 4] & 0x1f));
  uVar8 = 0;
  uVar9 = 0;
  if (0 < (int)uVar3) {
    uVar9 = (ulong)uVar3;
  }
  do {
    if (uVar9 == uVar8) {
LAB_007a4f9f:
      return (long)(int)uVar3 <= (long)uVar8;
    }
    uVar1 = *(uint *)((long)*inputs + uVar8 * 4);
    a = *(float *)((long)*outputs + uVar8 * 4);
    dVar10 = ldexp((double)(ulong)uVar1,*(int *)((long)inputs[1] + uVar8 * 4));
    dVar4 = getUlpDiffIgnoreZeroSign(a,SUB84(dVar10,0));
    local_44.m_value = uVar1;
    iVar5 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_44);
    if (uVar7 < dVar4) {
      poVar6 = std::operator<<((ostream *)&(local_40->super_CommonFunctionTestInstance).m_failMsg,
                               "Expected [");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar8);
      poVar6 = std::operator<<(poVar6,"] = ");
      local_34.value = SUB84(dVar10,0);
      poVar6 = anon_unknown_0::operator<<(poVar6,&local_34);
      poVar6 = std::operator<<(poVar6,", (exp = ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
      poVar6 = std::operator<<(poVar6,") with ULP threshold ");
      hex.value._4_4_ = 0;
      hex.value._0_4_ = uVar7;
      poVar6 = tcu::Format::operator<<(poVar6,hex);
      poVar6 = std::operator<<(poVar6,", got ULP diff ");
      hex_00.value._4_4_ = 0;
      hex_00.value._0_4_ = dVar4;
      tcu::Format::operator<<(poVar6,hex_00);
      goto LAB_007a4f9f;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		const int				mantissaBits	= getMinMantissaBits(precision);
		const deUint32			maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const int		in1			= ((const int*)inputs[1])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const float		refOut0		= ldexp(in0, in1);
			const deUint32	ulpDiff		= getUlpDiffIgnoreZeroSign(out0, refOut0);

			const int		inExp		= tcu::Float32(in0).exponent();

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(refOut0) << ", (exp = " << inExp << ") with ULP threshold "
						  << tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}